

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_0::PointCase::testRender(PointCase *this)

{
  Vector<int,_4> *this_00;
  Surface *pSVar1;
  Surface *pSVar2;
  ulong uVar3;
  pointer ppSVar4;
  int iVar5;
  int depthBits;
  undefined4 uVar6;
  undefined4 uVar7;
  RenderTarget *pRVar8;
  RenderContext *context;
  PixelFormat *colorBits;
  MessageBuilder *pMVar9;
  size_type sVar10;
  const_reference pvVar11;
  _anonymous_namespace_ *this_01;
  TestLog *pTVar12;
  Vec4 *p;
  ConstPixelBufferAccess local_73f8;
  allocator<char> local_73c9;
  string local_73c8;
  allocator<char> local_73a1;
  string local_73a0;
  LogImage local_7380;
  ConstPixelBufferAccess local_72f0;
  allocator<char> local_72c1;
  string local_72c0;
  allocator<char> local_7299;
  string local_7298;
  LogImage local_7278;
  ConstPixelBufferAccess local_71e8;
  allocator<char> local_71b9;
  string local_71b8;
  allocator<char> local_7191;
  string local_7190;
  LogImage local_7170;
  allocator<char> local_70d9;
  string local_70d8;
  allocator<char> local_70b1;
  string local_70b0;
  LogImageSet local_7090;
  MessageBuilder local_7050;
  PixelBufferAccess local_6ed0;
  ConstPixelBufferAccess local_6ea8;
  ConstPixelBufferAccess local_6e80;
  MessageBuilder local_6e58;
  MessageBuilder local_6cd8;
  int local_6b58 [2];
  int faultyPixels;
  int kernelRadius;
  Surface diffMask;
  GLint colorLoc;
  GLint pointSizeLoc;
  GLint positionLoc;
  deUint32 programId;
  Surface *dstSurface;
  Context *ctx;
  undefined1 local_6b10 [4];
  int contextNdx;
  float local_6af0;
  float local_6aec;
  float local_6ae8;
  float local_6ae4;
  MessageBuilder local_6ae0;
  ulong local_6960;
  size_t ndx;
  MessageBuilder local_67d8;
  size_t *local_6658;
  Surface *surfaces [2];
  Context *contexts [2];
  undefined1 local_6630 [8];
  Surface refSurface;
  Surface testSurface;
  PositionColorShader program;
  MultisamplePixelBufferAccess local_6480;
  MultisamplePixelBufferAccess local_6458;
  undefined1 local_6430 [8];
  ReferenceContext refContext;
  ReferenceContextBuffers buffers;
  undefined1 local_1f8 [8];
  ReferenceContextLimits limits;
  undefined1 local_190 [8];
  GLContext glesContext;
  TestLog *log;
  int numSamples;
  PointCase *this_local;
  
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  iVar5 = tcu::RenderTarget::getNumSamples(pRVar8);
  iVar5 = de::max<int>(iVar5,1);
  glesContext.m_programs.
  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)tcu::TestContext::getLog
                          ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode
                           .m_testCtx);
  context = Context::getRenderContext((this->super_RenderTestCase).super_TestCase.m_context);
  ppSVar4 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  this_00 = (Vector<int,_4> *)((long)&limits.extensionStr.field_2 + 8);
  tcu::Vector<int,_4>::Vector(this_00,0,0,200,200);
  sglr::GLContext::GLContext((GLContext *)local_190,context,(TestLog *)ppSVar4,0,this_00);
  sglr::ReferenceContextLimits::ReferenceContextLimits((ReferenceContextLimits *)local_1f8);
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  colorBits = tcu::RenderTarget::getPixelFormat(pRVar8);
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  depthBits = tcu::RenderTarget::getDepthBits(pRVar8);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,colorBits,depthBits,0,200,200,iVar5);
  sglr::ReferenceContextBuffers::getColorbuffer
            (&local_6458,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextBuffers::getDepthbuffer
            (&local_6480,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)&program.super_ShaderProgram.m_hasGeometryShader,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_6430,(ReferenceContextLimits *)local_1f8,&local_6458,
             &local_6480,
             (MultisamplePixelBufferAccess *)&program.super_ShaderProgram.m_hasGeometryShader);
  PositionColorShader::PositionColorShader((PositionColorShader *)&testSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)&refSurface.m_pixels.m_cap,200,200);
  tcu::Surface::Surface((Surface *)local_6630,200,200);
  surfaces[1] = (Surface *)local_190;
  local_6658 = &refSurface.m_pixels.m_cap;
  surfaces[0] = (Surface *)local_6630;
  tcu::TestLog::operator<<
            (&local_67d8,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar9 = tcu::MessageBuilder::operator<<(&local_67d8,(char (*) [16])"Viewport: left=");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(this->m_viewport).left);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])"\tbottom=");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(this->m_viewport).bottom);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [8])"\twidth=");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(this->m_viewport).width);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])"\theight=");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(this->m_viewport).height);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_67d8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ndx,(char (*) [34])"Rendering points with point size ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_pointSize);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])0x12a6f61);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
  local_6960 = 0;
  while( true ) {
    uVar3 = local_6960;
    sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_points);
    if (sVar10 <= uVar3) break;
    tcu::TestLog::operator<<
              (&local_6ae0,
               (TestLog *)
               glesContext.m_programs.
               super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_6ae0,(char (*) [4])"\tx=");
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_points,local_6960);
    local_6ae4 = tcu::Vector<float,_4>::x(pvVar11);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_6ae4);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])"\ty=");
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_points,local_6960);
    local_6ae8 = tcu::Vector<float,_4>::y(pvVar11);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_6ae8);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])"\tz=");
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_points,local_6960);
    local_6aec = tcu::Vector<float,_4>::z(pvVar11);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_6aec);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])"\tw=");
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_points,local_6960);
    local_6af0 = tcu::Vector<float,_4>::w(pvVar11);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_6af0);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x12c5a38);
    this_01 = (_anonymous_namespace_ *)
              std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_points,local_6960);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              ((string *)local_6b10,this_01,p);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6b10);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)local_6b10);
    tcu::MessageBuilder::~MessageBuilder(&local_6ae0);
    local_6960 = local_6960 + 1;
  }
  for (ctx._4_4_ = 0; ctx._4_4_ < 2; ctx._4_4_ = ctx._4_4_ + 1) {
    pSVar1 = surfaces[(long)ctx._4_4_ + 1];
    pSVar2 = surfaces[(long)ctx._4_4_ + -1];
    uVar6 = (**(code **)(*(long *)pSVar1 + 0x3a8))(pSVar1,&testSurface.m_pixels.m_cap);
    uVar7 = (**(code **)(*(long *)pSVar1 + 0x2c8))(pSVar1,uVar6,"a_position");
    diffMask.m_pixels.m_cap._4_4_ =
         (**(code **)(*(long *)pSVar1 + 0x2c8))(pSVar1,uVar6,"a_pointSize");
    diffMask.m_pixels.m_cap._0_4_ = (**(code **)(*(long *)pSVar1 + 0x2c8))(pSVar1,uVar6,"a_color");
    (**(code **)(*(long *)pSVar1 + 0x150))(0,0,0,0x3f800000);
    (**(code **)(*(long *)pSVar1 + 0x158))(0x3f800000);
    (**(code **)(*(long *)pSVar1 + 0x168))(pSVar1,0x4100);
    (**(code **)(*(long *)pSVar1 + 0x28))
              (pSVar1,(this->m_viewport).left,(this->m_viewport).bottom,(this->m_viewport).width,
               (this->m_viewport).height);
    (**(code **)(*(long *)pSVar1 + 0x3b0))(pSVar1,uVar6);
    (**(code **)(*(long *)pSVar1 + 0x280))(pSVar1,uVar7);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_points,0);
    (**(code **)(*(long *)pSVar1 + 0x270))(pSVar1,uVar7,4,0x1406,0,0,pvVar11);
    (**(code **)(*(long *)pSVar1 + 0x298))(this->m_pointSize,pSVar1,diffMask.m_pixels.m_cap._4_4_);
    (**(code **)(*(long *)pSVar1 + 0x2b0))
              (0x3f800000,0x3f800000,pSVar1,(undefined4)diffMask.m_pixels.m_cap);
    sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_points);
    (**(code **)(*(long *)pSVar1 + 0x340))(pSVar1,0,0,sVar10 & 0xffffffff);
    (**(code **)(*(long *)pSVar1 + 0x288))(pSVar1,uVar7);
    (**(code **)(*(long *)pSVar1 + 0x3b0))(pSVar1,0);
    (**(code **)(*(long *)pSVar1 + 0x3b8))(pSVar1,uVar6);
    (**(code **)(*(long *)pSVar1 + 0x3d0))();
    (**(code **)(*(long *)pSVar1 + 0x400))(pSVar1,pSVar2,0,0,200);
  }
  tcu::Surface::Surface((Surface *)&faultyPixels,200,200);
  local_6b58[1] = 1;
  tcu::TestLog::operator<<
            (&local_6cd8,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar9 = tcu::MessageBuilder::operator<<(&local_6cd8,(char (*) [21])"Comparing images... ");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6cd8);
  tcu::TestLog::operator<<
            (&local_6e58,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar9 = tcu::MessageBuilder::operator<<(&local_6e58,(char (*) [28])"Deviation within radius of ")
  ;
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_6b58 + 1);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [13])" is allowed.");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6e58);
  ppSVar4 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6e80,(Surface *)&refSurface.m_pixels.m_cap);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6ea8,(Surface *)local_6630);
  tcu::Surface::getAccess(&local_6ed0,(Surface *)&faultyPixels);
  local_6b58[0] =
       compareBlackNonBlackImages((TestLog *)ppSVar4,&local_6e80,&local_6ea8,&local_6ed0,1);
  ppSVar4 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (0 < local_6b58[0]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70b0,"Images",&local_70b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70d8,"Image comparison",&local_70d9);
    tcu::LogImageSet::LogImageSet(&local_7090,&local_70b0,&local_70d8);
    pTVar12 = tcu::TestLog::operator<<((TestLog *)ppSVar4,&local_7090);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7190,"TestImage",&local_7191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_71b8,"Test image",&local_71b9);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_71e8,(Surface *)&refSurface.m_pixels.m_cap);
    tcu::LogImage::LogImage
              (&local_7170,&local_7190,&local_71b8,&local_71e8,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar12 = tcu::TestLog::operator<<(pTVar12,&local_7170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7298,"ReferenceImage",&local_7299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_72c0,"Reference image",&local_72c1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_72f0,(Surface *)local_6630);
    tcu::LogImage::LogImage
              (&local_7278,&local_7298,&local_72c0,&local_72f0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar12 = tcu::TestLog::operator<<(pTVar12,&local_7278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_73a0,"DifferenceMask",&local_73a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_73c8,"Difference mask",&local_73c9);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_73f8,(Surface *)&faultyPixels);
    tcu::LogImage::LogImage
              (&local_7380,&local_73a0,&local_73c8,&local_73f8,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar12 = tcu::TestLog::operator<<(pTVar12,&local_7380);
    pTVar12 = tcu::TestLog::operator<<(pTVar12,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_7050,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_7050,(char (*) [5])0x129c9b9);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_6b58);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [18])" faulty pixel(s).");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7050);
    tcu::LogImage::~LogImage(&local_7380);
    std::__cxx11::string::~string((string *)&local_73c8);
    std::allocator<char>::~allocator(&local_73c9);
    std::__cxx11::string::~string((string *)&local_73a0);
    std::allocator<char>::~allocator(&local_73a1);
    tcu::LogImage::~LogImage(&local_7278);
    std::__cxx11::string::~string((string *)&local_72c0);
    std::allocator<char>::~allocator(&local_72c1);
    std::__cxx11::string::~string((string *)&local_7298);
    std::allocator<char>::~allocator(&local_7299);
    tcu::LogImage::~LogImage(&local_7170);
    std::__cxx11::string::~string((string *)&local_71b8);
    std::allocator<char>::~allocator(&local_71b9);
    std::__cxx11::string::~string((string *)&local_7190);
    std::allocator<char>::~allocator(&local_7191);
    tcu::LogImageSet::~LogImageSet(&local_7090);
    std::__cxx11::string::~string((string *)&local_70d8);
    std::allocator<char>::~allocator(&local_70d9);
    std::__cxx11::string::~string((string *)&local_70b0);
    std::allocator<char>::~allocator(&local_70b1);
    tcu::TestContext::setTestResult
              ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface((Surface *)&faultyPixels);
  tcu::Surface::~Surface((Surface *)local_6630);
  tcu::Surface::~Surface((Surface *)&refSurface.m_pixels.m_cap);
  PositionColorShader::~PositionColorShader((PositionColorShader *)&testSurface.m_pixels.m_cap);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6430);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers
            ((ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)local_1f8);
  sglr::GLContext::~GLContext((GLContext *)local_190);
  return;
}

Assistant:

void PointCase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering points with point size " << m_pointSize << ". Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_points.size(); ++ndx)
		log << TestLog::Message
				<< "\tx=" << m_points[ndx].x()
				<< "\ty=" << m_points[ndx].y()
				<< "\tz=" << m_points[ndx].z()
				<< "\tw=" << m_points[ndx].w()
				<< "\t" << genClippingPointInfoString(m_points[ndx])
				<< TestLog::EndMessage;

	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		pointSizeLoc	= ctx.getAttribLocation(programId, "a_pointSize");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.vertexAttribPointer			(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &m_points[0]);
		ctx.vertexAttrib1f				(pointSizeLoc, m_pointSize);
		ctx.vertexAttrib4f				(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
		ctx.drawArrays					(GL_POINTS, 0, (glw::GLsizei)m_points.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	// do the comparison
	{
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const int			kernelRadius	= 1;
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}